

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

void Gia_PolynPrintMono(Vec_Int_t *vConst,Vec_Int_t *vMono,int Prev)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = Vec_IntEntry(vConst,0);
  iVar5 = -iVar3;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  uVar1 = 0x7c;
  if (iVar5 == Prev) {
    uVar1 = 0x20;
  }
  printf("%c ",uVar1);
  for (iVar5 = 0; iVar5 < vConst->nSize; iVar5 = iVar5 + 1) {
    iVar3 = Vec_IntEntry(vConst,iVar5);
    pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
    if (iVar3 < 0) {
      pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
    }
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    printf("%s2^%d",pcVar2 + 0x4a,(ulong)(iVar4 - 1));
  }
  for (iVar5 = 0; iVar5 < vMono->nSize; iVar5 = iVar5 + 1) {
    iVar3 = Vec_IntEntry(vMono,iVar5);
    printf(" * i%d",(ulong)(iVar3 - 1));
  }
  putchar(10);
  return;
}

Assistant:

void Gia_PolynPrintMono( Vec_Int_t * vConst, Vec_Int_t * vMono, int Prev )
{
    int k, Entry;
    printf( "%c ", Prev != Abc_AbsInt(Vec_IntEntry(vConst, 0)) ? '|' : ' ' );
    Vec_IntForEachEntry( vConst, Entry, k )
        printf( "%s2^%d", Entry < 0 ? "-" : "+", Abc_AbsInt(Entry)-1 );
    Vec_IntForEachEntry( vMono, Entry, k )
        printf( " * i%d", Entry-1 );
    printf( "\n" );
}